

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalTopN::GetLocalSinkState(PhysicalTopN *this,ExecutionContext *context)

{
  _func_int **in_RAX;
  ExecutionContext *in_RDX;
  _func_int **local_18;
  
  local_18 = in_RAX;
  make_uniq<duckdb::TopNLocalSinkState,duckdb::ExecutionContext&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<duckdb::BoundOrderByNode,true>const&,unsigned_long_const&,unsigned_long_const&>
            ((duckdb *)&local_18,in_RDX,(vector<duckdb::LogicalType,_true> *)&context[1].pipeline,
             (vector<duckdb::BoundOrderByNode,_true> *)&context[5].thread,
             (unsigned_long *)&context[6].thread,(unsigned_long *)&context[6].pipeline);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = local_18;
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalTopN::GetLocalSinkState(ExecutionContext &context) const {
	return make_uniq<TopNLocalSinkState>(context, types, orders, limit, offset);
}